

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O3

bool __thiscall miniscript::Node<unsigned_int>::CheckOpsLimit(Node<unsigned_int> *this)

{
  byte bVar1;
  long in_FS_OFFSET;
  
  if (this->m_script_ctx == P2WSH) {
    bVar1 = (this->ops).sat.valid ^ 1U | (this->ops).sat.value + (this->ops).count < 0xca;
  }
  else {
    bVar1 = 1;
    if (this->m_script_ctx != TAPSCRIPT) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h"
                    ,0xf6,"bool miniscript::IsTapscript(MiniscriptContext)");
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return (bool)bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CheckOpsLimit() const {
        if (IsTapscript(m_script_ctx)) return true;
        if (const auto ops = GetOps()) return *ops <= MAX_OPS_PER_SCRIPT;
        return true;
    }